

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O3

int __thiscall miniros::TransportUDP::close(TransportUDP *this,int __fd)

{
  Callback *__x;
  Level level;
  void *logger_handle;
  bool bVar1;
  int iVar2;
  uint uVar3;
  _Manager_type in_RAX;
  undefined7 extraout_var;
  char *pcVar4;
  _Any_data local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Callback disconnect_cb;
  
  disconnect_cb.super__Function_base._M_manager = (_Manager_type)0x0;
  disconnect_cb._M_invoker = (_Invoker_type)0x0;
  disconnect_cb.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  disconnect_cb.super__Function_base._M_functor._8_8_ = 0;
  if (this->closed_ == false) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->close_mutex_);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    if (this->closed_ == false) {
      this->closed_ = true;
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (close::loc.initialized_ == false) {
        local_68._M_unused._M_object = &local_58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"miniros.transport_udp","");
        console::initializeLogLocation(&close::loc,(string *)&local_68,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_unused._0_8_ != &local_58) {
          operator_delete(local_68._M_unused._M_object,(ulong)(local_58._M_allocated_capacity + 1));
        }
      }
      if (close::loc.level_ != Debug) {
        console::setLogLocationLevel(&close::loc,Debug);
        console::checkLogLocationEnabled(&close::loc);
      }
      if (close::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,close::loc.logger_,close::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                       ,0x141,"virtual void miniros::TransportUDP::close()","UDP socket [%d] closed"
                       ,(ulong)(uint)this->sock_);
      }
      if (this->poll_set_ != (PollSet *)0x0) {
        PollSet::delSocket(this->poll_set_,this->sock_);
      }
      iVar2 = close_socket(&this->sock_);
      if (iVar2 != 0) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (close()::loc.initialized_ == false) {
          local_68._M_unused._M_object = &local_58;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"miniros.transport_udp","");
          console::initializeLogLocation(&close()::loc,(string *)&local_68,Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_unused._0_8_ != &local_58) {
            operator_delete(local_68._M_unused._M_object,(ulong)(local_58._M_allocated_capacity + 1)
                           );
          }
        }
        if (close()::loc.level_ != Error) {
          console::setLogLocationLevel(&close()::loc,Error);
          console::checkLogLocationEnabled(&close()::loc);
        }
        logger_handle = close()::loc.logger_;
        level = close()::loc.level_;
        if (close()::loc.logger_enabled_ == true) {
          uVar3 = this->sock_;
          pcVar4 = last_socket_error_string();
          console::print((FilterBase *)0x0,logger_handle,level,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_udp.cpp"
                         ,0x14c,"virtual void miniros::TransportUDP::close()",
                         "Error closing socket [%d]: [%s]",(ulong)uVar3,pcVar4);
        }
      }
      this->sock_ = -1;
      __x = &(this->super_Transport).disconnect_cb_;
      std::function<void_(const_std::shared_ptr<miniros::Transport>_&)>::operator=
                (&disconnect_cb,__x);
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = 0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      std::function<void_(const_std::shared_ptr<miniros::Transport>_&)>::operator=
                (__x,(function<void_(const_std::shared_ptr<miniros::Transport>_&)> *)&local_68);
      if ((code *)local_58._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
      }
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = 0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      std::function<void_(const_std::shared_ptr<miniros::Transport>_&)>::operator=
                (&(this->super_Transport).read_cb_,
                 (function<void_(const_std::shared_ptr<miniros::Transport>_&)> *)&local_68);
      if ((code *)local_58._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
      }
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = 0;
      local_68._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::function<void_(const_std::shared_ptr<miniros::Transport>_&)>::operator=
                (&(this->super_Transport).write_cb_,
                 (function<void_(const_std::shared_ptr<miniros::Transport>_&)> *)&local_68);
      if ((code *)local_58._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
      }
    }
    uVar3 = pthread_mutex_unlock((pthread_mutex_t *)&this->close_mutex_);
    in_RAX = (_Manager_type)(ulong)uVar3;
    if (disconnect_cb.super__Function_base._M_manager != (_Manager_type)0x0) {
      std::__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<miniros::Transport,void>
                ((__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2> *)local_68._M_pod_data
                 ,(__weak_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2> *)
                  &(this->super_Transport).super_enable_shared_from_this<miniros::Transport>);
      if (disconnect_cb.super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*disconnect_cb._M_invoker)
                ((_Any_data *)&disconnect_cb,(shared_ptr<miniros::Transport> *)&local_68);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      in_RAX = disconnect_cb.super__Function_base._M_manager;
      if (disconnect_cb.super__Function_base._M_manager != (_Manager_type)0x0) {
        bVar1 = (*disconnect_cb.super__Function_base._M_manager)
                          ((_Any_data *)&disconnect_cb,(_Any_data *)&disconnect_cb,__destroy_functor
                          );
        in_RAX = (_Manager_type)CONCAT71(extraout_var,bVar1);
      }
    }
  }
  return (int)in_RAX;
}

Assistant:

bool TransportUDP::createIncoming(int port, bool is_server)
{
  is_server_ = is_server;

  sock_ = socket(AF_INET, SOCK_DGRAM, 0);

  if (sock_ == ROS_INVALID_SOCKET)
  {
    MINIROS_ERROR("socket() failed with error [%s]", last_socket_error_string());
    return false;
  }

  server_address_.sin_family = AF_INET;
  server_address_.sin_port = htons(port);
  server_address_.sin_addr.s_addr = isOnlyLocalhostAllowed() ? 
                                    htonl(INADDR_LOOPBACK) :
                                    INADDR_ANY;
  if (bind(sock_, (sockaddr *)&server_address_, sizeof(server_address_)) < 0)
  {
    MINIROS_ERROR("bind() failed with error [%s]",  last_socket_error_string());
    return false;
  }

  socklen_t len = sizeof(server_address_);
  getsockname(sock_, (sockaddr *)&server_address_, &len);
  server_port_ = ntohs(server_address_.sin_port);
  MINIROS_DEBUG("UDPROS server listening on port [%d]", server_port_);

  if (!initializeSocket())
  {
    return false;
  }

  enableRead();

  return true;
}